

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O3

void __thiscall anon_unknown.dwarf_495b9a::ImplPosix::StartReceivingTokens(ImplPosix *this)

{
  Connection CVar1;
  int status;
  uv_stream_t *stream;
  long lVar2;
  
  CVar1 = this->Conn;
  if (CVar1 == None) {
    return;
  }
  if (this->ReceivingTokens != false) {
    return;
  }
  if (CVar1 == FDs) {
    lVar2 = 0x70;
  }
  else {
    if (CVar1 != FIFO) {
      stream = (uv_stream_t *)0x0;
      goto LAB_0023c37f;
    }
    lVar2 = 0x90;
  }
  stream = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_
                     ((uv_pipe_ptr *)((long)&(this->super_Impl)._vptr_Impl + lVar2));
LAB_0023c37f:
  status = uv_read_start(stream,OnAllocateCB,OnReadCB);
  if (status == 0) {
    this->ReceivingTokens = true;
    return;
  }
  Disconnect(this,status);
  return;
}

Assistant:

void ImplPosix::StartReceivingTokens()
{
  if (this->Conn == Connection::None) {
    return;
  }
  if (this->ReceivingTokens) {
    return;
  }

  int status = uv_read_start(this->GetReader(), &ImplPosix::OnAllocateCB,
                             &ImplPosix::OnReadCB);
  if (status != 0) {
    this->Disconnect(status);
    return;
  }

  this->ReceivingTokens = true;
}